

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O0

void __thiscall LogMessage::Flush(LogMessage *this)

{
  ostream *poVar1;
  size_t __n;
  void *__ptr;
  size_t n;
  string s;
  LogMessage *this_local;
  
  poVar1 = stream(this);
  std::operator<<(poVar1,"\n");
  if (re2::FLAGS_minloglevel <= this->severity_) {
    std::__cxx11::ostringstream::str();
    __n = std::__cxx11::string::size();
    __ptr = (void *)std::__cxx11::string::data();
    fwrite(__ptr,1,__n,_stderr);
    std::__cxx11::string::~string((string *)&n);
  }
  this->flushed_ = true;
  return;
}

Assistant:

void Flush() {
    stream() << "\n";
    if (severity_ >= re2::FLAGS_minloglevel) {
      string s = str_.str();
      size_t n = s.size();
      if (fwrite(s.data(), 1, n, stderr) < n) {}  // shut up gcc
    }
    flushed_ = true;
  }